

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

int __thiscall QWizard::addPage(QWizard *this,QWizardPage *page)

{
  long lVar1;
  int theid;
  
  lVar1 = *(long *)(*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x2e0);
  theid = 0;
  if ((lVar1 != 0) && (theid = 0, *(long *)(lVar1 + 0x30) != 0)) {
    lVar1 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(lVar1 + 0x10));
    theid = *(int *)(lVar1 + 0x20) + 1;
  }
  setPage(this,theid,page);
  return theid;
}

Assistant:

int QWizard::addPage(QWizardPage *page)
{
    Q_D(QWizard);
    int theid = 0;
    if (!d->pageMap.isEmpty())
        theid = d->pageMap.lastKey() + 1;
    setPage(theid, page);
    return theid;
}